

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O1

ProviderPtr __thiscall IlmThread_3_2::ThreadPool::Data::getProvider(Data *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined8 *in_RSI;
  ProviderPtr PVar2;
  _Sp_locker __lock;
  _Sp_locker local_12 [2];
  
  std::_Sp_locker::_Sp_locker(local_12,in_RSI);
  (this->_provider).
  super___shared_ptr<IlmThread_3_2::ThreadPoolProvider,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)*in_RSI;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RSI[1];
  (this->_provider).
  super___shared_ptr<IlmThread_3_2::ThreadPoolProvider,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  std::_Sp_locker::~_Sp_locker(local_12);
  PVar2.super___shared_ptr<IlmThread_3_2::ThreadPoolProvider,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  PVar2.super___shared_ptr<IlmThread_3_2::ThreadPoolProvider,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ProviderPtr)
         PVar2.super___shared_ptr<IlmThread_3_2::ThreadPoolProvider,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ProviderPtr getProvider () const { return std::atomic_load (&_provider); }